

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::Parse3DFace(DXFImporter *this,LineReader *reader,FileData *output)

{
  pointer *ppuVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  pointer pBVar4;
  element_type *this_00;
  iterator iVar5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator __position;
  iterator __position_00;
  float fVar7;
  aiColor4D aVar8;
  char *pcVar9;
  Logger *this_02;
  bool check_comma;
  uint uVar10;
  char cVar11;
  undefined4 uVar12;
  aiVector3t<float> *__args;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  uint cnt;
  aiVector3D vip [4];
  aiColor4D clr;
  float local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_5c;
  aiColor4D local_58;
  FileData *local_48;
  string *local_40;
  string *local_38;
  
  pBVar4 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = (PolyLine *)operator_new(0xa8);
  (local_98->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98->flags = 0;
  (local_98->layer)._M_dataplus._M_p = (pointer)&(local_98->layer).field_2;
  uVar15 = 0;
  (local_98->layer)._M_string_length = 0;
  (local_98->layer).field_2._M_local_buf[0] = '\0';
  (local_98->desc)._M_dataplus._M_p = (pointer)&(local_98->desc).field_2;
  (local_98->desc)._M_string_length = 0;
  (local_98->desc).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DXF::PolyLine*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uStack_90,local_98);
  __args = (aiVector3t<float> *)&local_98;
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
  ::emplace_back<std::shared_ptr<Assimp::DXF::PolyLine>>
            ((vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
              *)(pBVar4 + -1),(shared_ptr<Assimp::DXF::PolyLine> *)__args);
  if (uStack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_90);
  }
  this_00 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].lines.
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  uStack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = AI_DXF_DEFAULT_COLOR;
  if (reader->end < 2) {
    local_48 = output;
    local_38 = &reader->value;
    local_40 = (string *)&this_00->layer;
    local_a0 = 0;
    bVar13 = 0;
    bVar16 = false;
    bVar17 = false;
    local_a4 = 0;
    do {
      check_comma = SUB81(uVar15,0);
      switch(reader->groupcode) {
      case 0:
        goto switchD_004194f7_caseD_0;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 9:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        break;
      case 8:
        std::__cxx11::string::_M_assign(local_40);
        break;
      case 10:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        local_98._0_4_ = local_a8;
        goto LAB_004196c2;
      case 0xb:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        uStack_90._4_4_ = local_a8;
        goto LAB_00419717;
      case 0xc:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        uStack_80 = CONCAT44(uStack_80._4_4_,local_a8);
        goto LAB_004196eb;
      case 0xd:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        local_78 = CONCAT44(local_a8,(float)local_78);
        goto LAB_00419647;
      case 0x14:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        local_98._4_4_ = local_a8;
        goto LAB_004196c2;
      case 0x15:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        local_88 = CONCAT44(local_88._4_4_,local_a8);
        goto LAB_00419717;
      case 0x16:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        uStack_80 = CONCAT44(local_a8,(float)uStack_80);
        goto LAB_004196eb;
      case 0x17:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        uStack_70 = CONCAT44(uStack_70._4_4_,local_a8);
        goto LAB_00419647;
      case 0x1e:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        uStack_90._0_4_ = local_a8;
LAB_004196c2:
        bVar13 = 1;
        break;
      case 0x1f:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        local_88 = CONCAT44(local_a8,(undefined4)local_88);
LAB_00419717:
        local_a0 = CONCAT71((int7)((ulong)pcVar9 >> 8),1);
        break;
      case 0x20:
        local_a8 = 0.0;
        pcVar9 = fast_atoreal_move<float>
                           ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,
                            (float *)0x1,check_comma);
        local_78 = CONCAT44(local_78._4_4_,local_a8);
LAB_004196eb:
        local_a4 = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
        break;
      case 0x21:
        local_a8 = 0.0;
        fast_atoreal_move<float>
                  ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_a8,(float *)0x1,
                   check_comma);
        uStack_70 = CONCAT44(local_a8,(float)uStack_70);
LAB_00419647:
        bVar16 = true;
        bVar17 = true;
        break;
      default:
        if (reader->groupcode == 0x3e) {
          pcVar9 = (reader->value)._M_dataplus._M_p;
          cVar11 = *pcVar9;
          if ((byte)(cVar11 - 0x3aU) < 0xf6) {
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            do {
              pcVar9 = pcVar9 + 1;
              uVar10 = (uint)(byte)(cVar11 - 0x30) + uVar10 * 10;
              cVar11 = *pcVar9;
            } while (0xf5 < (byte)(cVar11 - 0x3aU));
            uVar10 = uVar10 & 0xf;
          }
          uVar15 = (ulong)(uVar10 << 4);
          local_58 = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + uVar15);
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
switchD_004194f7_caseD_0:
    bVar13 = bVar13 ^ 1;
    bVar14 = (byte)local_a0 ^ 1;
    output = local_48;
    uVar12 = local_a4;
  }
  else {
    bVar13 = 1;
    bVar16 = false;
    bVar17 = false;
    bVar14 = 1;
    uVar12 = 0;
  }
  if ((local_78._4_4_ == (float)uStack_80) && (!NAN(local_78._4_4_) && !NAN((float)uStack_80))) {
    if (((float)uStack_70 == uStack_80._4_4_) && (!NAN((float)uStack_70) && !NAN(uStack_80._4_4_)))
    {
      bVar17 = false;
      if (uStack_70._4_4_ != (float)local_78) {
        bVar17 = bVar16;
      }
      if (NAN(uStack_70._4_4_) || NAN((float)local_78)) {
        bVar17 = bVar16;
      }
    }
  }
  if (bVar17) {
    if (((~(byte)uVar12 | bVar13 | bVar14) & 1) != 0) {
LAB_004197fe:
      this_02 = DefaultLogger::get();
      Logger::warn(this_02,"DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
      pBVar4 = (output->blocks).
               super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
               super__Vector_impl_data._M_finish;
      psVar6 = pBVar4[-1].lines.
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar4[-1].lines.
      super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar6 + -1;
      this_01 = psVar6[-1].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
  }
  else if (bVar13 != 0 || (bVar14 & 1) != 0) goto LAB_004197fe;
  local_a8 = (float)(uint)(byte)(bVar17 + ((byte)uVar12 & 1) + 2);
  iVar5._M_current =
       (this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this_00->counts,iVar5,
               (uint *)&local_a8);
  }
  else {
    *iVar5._M_current = (uint)local_a8;
    ppuVar1 = &(this_00->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if (local_a8 != 0.0) {
    uVar15 = 0;
    do {
      local_5c = (int)((ulong)((long)(this_00->positions).
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->positions).
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      iVar5._M_current =
           (this_00->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this_00->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this_00->indices,iVar5,&local_5c);
      }
      else {
        *iVar5._M_current = local_5c;
        ppuVar1 = &(this_00->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      __position._M_current =
           (this_00->positions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this_00,__position
                   ,__args);
      }
      else {
        (__position._M_current)->z = __args->z;
        fVar7 = __args->y;
        (__position._M_current)->x = __args->x;
        (__position._M_current)->y = fVar7;
        ppaVar2 = &(this_00->positions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      aVar8 = local_58;
      __position_00._M_current =
           (this_00->colors).
           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this_00->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
        _M_realloc_insert<aiColor4t<float>const&>
                  ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&this_00->colors,
                   __position_00,&local_58);
      }
      else {
        (__position_00._M_current)->r = local_58.r;
        (__position_00._M_current)->g = local_58.g;
        (__position_00._M_current)->b = local_58.b;
        (__position_00._M_current)->a = local_58.a;
        ppaVar3 = &(this_00->colors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppaVar3 = *ppaVar3 + 1;
        local_58 = aVar8;
      }
      uVar15 = uVar15 + 1;
      __args = __args + 1;
    } while (uVar15 < (uint)local_a8);
  }
  return;
}

Assistant:

void DXFImporter::Parse3DFace(DXF::LineReader& reader, DXF::FileData& output)
{
    // (note) this is also used for for parsing line entities, so we
    // must handle the vertex_count == 2 case as well.

    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() )  );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    aiVector3D vip[4];
    aiColor4D  clr = AI_DXF_DEFAULT_COLOR;

    bool b[4] = {false,false,false,false};
    while( !reader.End() ) {

        // next entity with a groupcode == 0 is probably already the next vertex or polymesh entity
        if (reader.GroupCode() == 0) {
            break;
        }
        switch (reader.GroupCode())
        {

        // 8 specifies the layer
        case 8:
            line.layer = reader.Value();
            break;

        // x position of the first corner
        case 10:
            vip[0].x = reader.ValueAsFloat();
            b[2] = true;
            break;

        // y position of the first corner
        case 20:
            vip[0].y = reader.ValueAsFloat();
            b[2] = true;
            break;

        // z position of the first corner
        case 30:
            vip[0].z = reader.ValueAsFloat();
            b[2] = true;
            break;

        // x position of the second corner
        case 11:
            vip[1].x = reader.ValueAsFloat();
            b[3] = true;
            break;

        // y position of the second corner
        case 21:
            vip[1].y = reader.ValueAsFloat();
            b[3] = true;
            break;

        // z position of the second corner
        case 31:
            vip[1].z = reader.ValueAsFloat();
            b[3] = true;
            break;

        // x position of the third corner
        case 12:
            vip[2].x = reader.ValueAsFloat();
            b[0] = true;
            break;

        // y position of the third corner
        case 22:
            vip[2].y = reader.ValueAsFloat();
            b[0] = true;
            break;

        // z position of the third corner
        case 32:
            vip[2].z = reader.ValueAsFloat();
            b[0] = true;
            break;

        // x position of the fourth corner
        case 13:
            vip[3].x = reader.ValueAsFloat();
            b[1] = true;
            break;

        // y position of the fourth corner
        case 23:
            vip[3].y = reader.ValueAsFloat();
            b[1] = true;
            break;

        // z position of the fourth corner
        case 33:
            vip[3].z = reader.ValueAsFloat();
            b[1] = true;
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        ++reader;
    }

    // the fourth corner may even be identical to the third,
    // in this case we treat it as if it didn't exist.
    if (vip[3] == vip[2]) {
        b[1] = false;
    }

    // sanity checks to see if we got something meaningful
    if ((b[1] && !b[0]) || !b[2] || !b[3]) {
        ASSIMP_LOG_WARN("DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
        output.blocks.back().lines.pop_back();
        return;
    }

    const unsigned int cnt = (2+(b[0]?1:0)+(b[1]?1:0));
    line.counts.push_back(cnt);

    for (unsigned int i = 0; i < cnt; ++i) {
        line.indices.push_back(static_cast<unsigned int>(line.positions.size()));
        line.positions.push_back(vip[i]);
        line.colors.push_back(clr);
    }
}